

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoboKin_dns.c
# Opt level: O2

int main(void)

{
  long lVar1;
  int iVar2;
  N_Vector y;
  void *retvalvalue;
  long *retvalvalue_00;
  void *retvalvalue_01;
  void *retvalvalue_02;
  FILE *__stream;
  long lVar3;
  int iVar4;
  int retval;
  SUNContext sunctx;
  void *local_40;
  void *local_38;
  
  puts("\nRobot Kinematics Example");
  puts("8 variables; -1 <= x_i <= 1");
  puts("KINSOL problem size: 8 + 2*8 = 24 \n");
  retval = SUNContext_Create(0,&sunctx);
  iVar4 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    y = (N_Vector)N_VNew_Serial(0x18,sunctx);
    iVar2 = check_retval(y,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      retvalvalue = (void *)N_VNew_Serial(0x18,sunctx);
      iVar2 = check_retval(retvalvalue,"N_VNew_Serial",0);
      if (iVar2 == 0) {
        retvalvalue_00 = (long *)N_VNew_Serial(0x18,sunctx);
        iVar2 = check_retval(retvalvalue_00,"N_VNew_Serial",0);
        if (iVar2 == 0) {
          retvalvalue_01 = (void *)KINCreate(sunctx);
          local_38 = retvalvalue_01;
          iVar2 = check_retval(retvalvalue_01,"KINCreate",0);
          if (iVar2 == 0) {
            retval = KINInit(retvalvalue_01,func,y);
            iVar4 = 1;
            iVar2 = check_retval(&retval,"KINInit",1);
            if (iVar2 == 0) {
              N_VConst(0,retvalvalue_00);
              lVar1 = *(long *)(*retvalvalue_00 + 0x10);
              for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
                *(undefined8 *)(lVar1 + 0x40 + lVar3 * 8) = 0x3ff0000000000000;
              }
              retval = KINSetConstraints(retvalvalue_01,retvalvalue_00);
              iVar4 = 1;
              iVar2 = check_retval(&retval,"KINSetConstraints",1);
              if (iVar2 == 0) {
                retval = KINSetFuncNormTol(0x3ee4f8b588e368f1,retvalvalue_01);
                iVar4 = 1;
                iVar2 = check_retval(&retval,"KINSetFuncNormTol",1);
                if (iVar2 == 0) {
                  retval = KINSetScaledStepTol(0x3ee4f8b588e368f1,retvalvalue_01);
                  iVar4 = 1;
                  iVar2 = check_retval(&retval,"KINSetScaledStepTol",1);
                  if (iVar2 == 0) {
                    retvalvalue_02 = (void *)SUNDenseMatrix(0x18,0x18,sunctx);
                    iVar2 = check_retval(retvalvalue_02,"SUNDenseMatrix",0);
                    if (iVar2 == 0) {
                      local_40 = (void *)SUNLinSol_Dense(y,retvalvalue_02,sunctx);
                      iVar2 = check_retval(local_40,"SUNLinSol_Dense",0);
                      if (iVar2 == 0) {
                        retval = KINSetLinearSolver(retvalvalue_01,local_40,retvalvalue_02);
                        iVar4 = 1;
                        iVar2 = check_retval(&retval,"KINSetLinearSolver",1);
                        if (iVar2 == 0) {
                          retval = KINSetJacFn(retvalvalue_01,jac);
                          iVar4 = 1;
                          iVar2 = check_retval(&retval,"KINSetJacFn",1);
                          if (iVar2 == 0) {
                            retval = KINSetMaxSetupCalls(retvalvalue_01,1);
                            iVar4 = 1;
                            iVar2 = check_retval(&retval,"KINSetMaxSetupCalls",1);
                            if (iVar2 == 0) {
                              N_VConst(0x3ff0000000000000,y);
                              lVar1 = *(long *)((long)y->content + 0x10);
                              for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
                                *(undefined8 *)(lVar1 + lVar3 * 8) = 0x3fe6a09e667f3bcd;
                              }
                              puts("Initial guess:");
                              PrintOutput(y);
                              N_VConst(0x3ff0000000000000,retvalvalue);
                              iVar4 = 1;
                              retval = KINSol(retvalvalue_01,y,1,retvalvalue,retvalvalue);
                              iVar2 = check_retval(&retval,"KINSol",1);
                              if (iVar2 == 0) {
                                puts("\nComputed solution:");
                                PrintOutput(y);
                                puts("\nFinal statsistics:");
                                iVar4 = 0;
                                retval = KINPrintAllStats(retvalvalue_01,_stdout,0);
                                __stream = fopen("kinRoboKin_dns_stats.csv","w");
                                retval = KINPrintAllStats(retvalvalue_01,__stream,1);
                                fclose(__stream);
                                N_VDestroy(y);
                                N_VDestroy(retvalvalue);
                                N_VDestroy(retvalvalue_00);
                                KINFree(&local_38);
                                SUNLinSolFree(local_40);
                                SUNMatDestroy(retvalvalue_02);
                                SUNContext_Free(&sunctx);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, scsteptol;
  N_Vector y, scale, constraints;
  int mset, retval, i;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;
  FILE* FID;

  y = scale = constraints = NULL;
  kmem                    = NULL;
  J                       = NULL;
  LS                      = NULL;

  printf("\nRobot Kinematics Example\n");
  printf("8 variables; -1 <= x_i <= 1\n");
  printf("KINSOL problem size: 8 + 2*8 = 24 \n\n");

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Create vectors for solution, scales, and constraints */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)constraints, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize and allocate memory for KINSOL */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  retval = KINInit(kmem, func, y); /* y passed as a template */
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* Set optional inputs */

  N_VConst(ZERO, constraints);
  for (i = NVAR + 1; i <= NEQ; i++) { Ith(constraints, i) = ONE; }

  retval = KINSetConstraints(kmem, constraints);
  if (check_retval(&retval, "KINSetConstraints", 1)) { return (1); }

  fnormtol = FTOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  scsteptol = STOL;
  retval    = KINSetScaledStepTol(kmem, scsteptol);
  if (check_retval(&retval, "KINSetScaledStepTol", 1)) { return (1); }

  /* Create dense SUNMatrix */
  J = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)J, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to KINSOL */
  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* Set the Jacobian function */
  retval = KINSetJacFn(kmem, jac);
  if (check_retval(&retval, "KINSetJacFn", 1)) { return (1); }

  /* Indicate exact Newton */

  mset   = 1;
  retval = KINSetMaxSetupCalls(kmem, mset);
  if (check_retval(&retval, "KINSetMaxSetupCalls", 1)) { return (1); }

  /* Initial guess */

  N_VConst(ONE, y);
  for (i = 1; i <= NVAR; i++) { Ith(y, i) = SUNRsqrt(TWO) / TWO; }

  printf("Initial guess:\n");
  PrintOutput(y);

  /* Call KINSol to solve problem */

  N_VConst(ONE, scale);
  retval = KINSol(kmem,           /* KINSol memory block */
                  y,              /* initial guess on input; solution vector */
                  KIN_LINESEARCH, /* global strategy choice */
                  scale,          /* scaling vector, for the variable cc */
                  scale);         /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  printf("\nComputed solution:\n");
  PrintOutput(y);

  /* Print final statistics to screen and file */

  printf("\nFinal statsistics:\n");
  retval = KINPrintAllStats(kmem, stdout, SUN_OUTPUTFORMAT_TABLE);

  FID    = fopen("kinRoboKin_dns_stats.csv", "w");
  retval = KINPrintAllStats(kmem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* free memory */
  N_VDestroy(y);
  N_VDestroy(scale);
  N_VDestroy(constraints);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  SUNContext_Free(&sunctx);

  return (0);
}